

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::PickRange::dim_forward
          (Dim *__return_storage_ptr__,PickRange *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  Dim *d;
  pointer pDVar1;
  bool bVar2;
  ostream *os;
  invalid_argument *this_00;
  uint uVar3;
  initializer_list<unsigned_int> x;
  string asStack_1b8 [32];
  ostringstream s;
  
  d = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)d != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x2d6,"virtual Dim cnn::PickRange::dim_forward(const vector<Dim> &) const");
  }
  bVar2 = LooksLikeVector(d);
  if (bVar2) {
    pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pDVar1->nd == 0) {
      uVar3 = 1;
    }
    else {
      uVar3 = pDVar1->d[0];
    }
    if (this->end <= uVar3) {
      _s = this->end - this->start;
      x._M_len = 1;
      x._M_array = (iterator)&s;
      Dim::Dim(__return_storage_ptr__,x,pDVar1->bd);
      return __return_storage_ptr__;
    }
    __assert_fail("end <= xs[0][0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x2db,"virtual Dim cnn::PickRange::dim_forward(const vector<Dim> &) const");
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Bad input dimensions in PickElement: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PickRange::dim_forward(const vector<Dim>& xs) const {
  assert(xs.size() == 1);
  if (!LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in PickElement: " << xs;
    throw std::invalid_argument(s.str());
  }
  assert(end <= xs[0][0]);
  return Dim({end - start}, xs[0].bd);
}